

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

void __thiscall SleighArchitecture::saveXmlHeader(SleighArchitecture *this,ostream *s)

{
  ostream *s_00;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  SleighArchitecture *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"name",&local_39);
  a_v(s,(string *)local_38,&this->filename);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"target",&local_71);
  a_v(s_00,(string *)local_70,&this->target);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void SleighArchitecture::saveXmlHeader(ostream &s) const

{
  a_v(s,"name",filename);
  a_v(s,"target",target);
}